

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O0

int __thiscall
libtorrent::aux::part_file::do_hash<libtorrent::lcrypto::hasher256>
          (part_file *this,hasher256 *ph,ptrdiff_t len,piece_index_t piece,int offset,error_code *ec
          )

{
  int iVar1;
  bool bVar2;
  bitfield_flag<unsigned_int,_libtorrent::aux::open_mode_tag,_void> bVar3;
  int iVar4;
  uint uVar5;
  error_category *cat;
  pointer ppVar6;
  error_code *ec_00;
  span<char> buf;
  span<const_char> local_e0;
  span<char> local_d0;
  int local_bc;
  long lStack_b8;
  int ret;
  int64_t slot_offset;
  undefined1 local_a8 [8];
  vector<char,_std::allocator<char>_> buffer;
  undefined1 local_84 [4];
  int local_80;
  file_handle f;
  slot_index_t slot;
  bool bStack_74;
  undefined3 uStack_73;
  undefined8 local_70;
  _Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
  local_68 [3];
  _Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
  local_50;
  iterator i;
  unique_lock<std::mutex> l;
  error_code *ec_local;
  int offset_local;
  ptrdiff_t len_local;
  hasher256 *ph_local;
  part_file *this_local;
  piece_index_t piece_local;
  
  ec_00 = ec;
  this_local._0_4_ = piece.m_val;
  ::std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&i,&this->m_mutex);
  local_50._M_cur =
       (__node_type *)
       ::std::
       unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
       ::find(&this->m_piece_map,(key_type *)&this_local);
  local_68[0]._M_cur =
       (__node_type *)
       ::std::
       unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
       ::end(&this->m_piece_map);
  bVar2 = ::std::__detail::operator==(&local_50,local_68);
  if (bVar2) {
    cat = boost::system::generic_category();
    boost::system::error_code::error_code((error_code *)&slot,2,cat);
    ec->val_ = slot.m_val;
    ec->failed_ = bStack_74;
    *(undefined3 *)&ec->field_0x5 = uStack_73;
    ec->cat_ = (error_category *)local_70;
    this_local._4_4_ = -1;
    f.m_fd = 1;
  }
  else {
    ppVar6 = ::std::__detail::
             _Node_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_false,_true>
                           *)&local_50);
    local_80 = (ppVar6->second).m_val;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 0x20;
    bVar3 = libtorrent::flags::operator|
                      ((bitfield_flag<unsigned_int,_libtorrent::aux::open_mode_tag,_void>)0x0,
                       (bitfield_flag<unsigned_int,_libtorrent::aux::open_mode_tag,_void>)0x20);
    open_file((part_file *)local_84,(open_mode_t)(uint)this,(error_code *)(ulong)bVar3.m_val);
    bVar2 = boost::system::error_code::operator_cast_to_bool(ec);
    if (bVar2) {
      this_local._4_4_ = -1;
      f.m_fd = 1;
    }
    else {
      ::std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&i);
      ::std::allocator<char>::allocator();
      ::std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_a8,len,
                 (allocator_type *)((long)&slot_offset + 7));
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&slot_offset + 7));
      iVar1 = this->m_header_size;
      iVar4 = strong_typedef::operator_cast_to_int((strong_typedef *)&local_80);
      lStack_b8 = (long)iVar1 + (long)iVar4 * (long)this->m_piece_size;
      uVar5 = file_handle::fd((file_handle *)local_84);
      span<char>::span<std::vector<char,std::allocator<char>>,char,void>
                (&local_d0,(vector<char,_std::allocator<char>_> *)local_a8);
      buf.m_len = lStack_b8 + offset;
      buf.m_ptr = (char *)local_d0.m_len;
      local_bc = pread_all((aux *)(ulong)uVar5,(handle_type)local_d0.m_ptr,buf,(int64_t)ec,ec_00);
      span<char_const>::span<std::vector<char,std::allocator<char>>,char,void>
                ((span<char_const> *)&local_e0,(vector<char,_std::allocator<char>_> *)local_a8);
      lcrypto::hasher256::update(ph,local_e0);
      this_local._4_4_ = local_bc;
      f.m_fd = 1;
      ::std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_a8);
    }
    file_handle::~file_handle((file_handle *)local_84);
  }
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&i);
  return this_local._4_4_;
}

Assistant:

int part_file::do_hash(Hasher& ph
		, std::ptrdiff_t const len
		, piece_index_t const piece
		, int const offset, error_code& ec)
	{
		TORRENT_ASSERT(offset >= 0);
		TORRENT_ASSERT(len >= 0);
		TORRENT_ASSERT(int(len) + offset <= m_piece_size);
		std::unique_lock<std::mutex> l(m_mutex);

		auto const i = m_piece_map.find(piece);
		if (i == m_piece_map.end())
		{
			ec = error_code(boost::system::errc::no_such_file_or_directory
				, boost::system::generic_category());
			return -1;
		}

		slot_index_t const slot = i->second;
		auto f = open_file(aux::open_mode::read_only | aux::open_mode::hidden, ec);
		if (ec) return -1;

		l.unlock();

		std::vector<char> buffer(static_cast<std::size_t>(len));
		std::int64_t const slot_offset = std::int64_t(m_header_size) + std::int64_t(static_cast<int>(slot)) * m_piece_size;
		int const ret = int(aux::pread_all(f.fd(), buffer, slot_offset + offset, ec));
		ph.update(buffer);
		return ret;
	}